

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitTraitStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,TraitStmt *stmt)

{
  pointer puVar1;
  FunctionStmt *pFVar2;
  string *psVar3;
  ostream *poVar4;
  pointer puVar5;
  stringstream s;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(Stmt::Trait ",0xd);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(stmt->name).lexeme._M_dataplus._M_p,
                      (stmt->name).lexeme._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (\n",3);
  local_1c0 = &this->m_ident;
  std::__cxx11::string::append((char *)local_1c0);
  puVar1 = (stmt->methods).
           super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c8 = __return_storage_ptr__;
  for (puVar5 = (stmt->methods).
                super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->m_ident)._M_dataplus._M_p,(this->m_ident)._M_string_length)
    ;
    pFVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>.
             _M_t.
             super__Tuple_impl<0UL,_enact::FunctionStmt_*,_std::default_delete<enact::FunctionStmt>_>
             .super__Head_base<0UL,_enact::FunctionStmt_*,_false>._M_head_impl;
    (*(pFVar2->super_Stmt)._vptr_Stmt[2])(&local_1e8,pFVar2,this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1e8,local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
  }
  std::__cxx11::string::erase((ulong)local_1c0,0);
  psVar3 = local_1c8;
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string AstSerialise::visitTraitStmt(TraitStmt &stmt) {
        std::stringstream s;

        s << m_ident << "(Stmt::Trait " << stmt.name.lexeme << " (\n";
        m_ident += "    ";

        for (auto &method : stmt.methods) {
            s << m_ident << visitStmt(*method) << "\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }